

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::_Test_OpenForAppend::~_Test_OpenForAppend(_Test_OpenForAppend *this)

{
  _Test_OpenForAppend *this_local;
  
  LogTest::~LogTest(&this->super_LogTest);
  return;
}

Assistant:

TEST(LogTest, OpenForAppend) {
  Write("hello");
  ReopenForAppend();
  Write("world");
  ASSERT_EQ("hello", Read());
  ASSERT_EQ("world", Read());
  ASSERT_EQ("EOF", Read());
}